

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickrst_avx2.c
# Opt level: O3

void av1_calc_proj_params_avx2
               (uint8_t *src8,int width,int height,int src_stride,uint8_t *dat8,int dat_stride,
               int32_t *flt0,int flt0_stride,int32_t *flt1,int flt1_stride,int64_t (*H) [2],
               int64_t *C,sgr_params_type *params)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  long lVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [32];
  int64_t aiVar14 [2];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [32];
  undefined1 auVar21 [64];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar13 [64];
  undefined1 auVar20 [64];
  
  if (params->r[0] < 1) {
    if (params->r[1] < 1) {
      return;
    }
    if (height < 1) {
      auVar16 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
      auVar12 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
    }
    else {
      auVar13 = ZEXT1664((undefined1  [16])0x0);
      uVar9 = 0;
      auVar17 = ZEXT1664((undefined1  [16])0x0);
      do {
        if (0 < width) {
          lVar10 = 0;
          do {
            auVar5._8_8_ = 0;
            auVar5._0_8_ = *(ulong *)(dat8 + lVar10);
            auVar12 = vpmovzxbd_avx2(auVar5);
            auVar11._8_8_ = 0;
            auVar11._0_8_ = *(ulong *)(src8 + lVar10);
            auVar16 = vpmovzxbd_avx2(auVar11);
            auVar23 = vpslld_avx2(auVar12,4);
            auVar19 = vpsubd_avx2(*(undefined1 (*) [32])(flt1 + lVar10),auVar23);
            auVar12 = vpsubd_avx2(auVar16,auVar12);
            auVar15 = vpslld_avx2(auVar12,4);
            auVar12 = vpmuldq_avx2(auVar19,auVar19);
            auVar12 = vpaddq_avx2(auVar13._0_32_,auVar12);
            auVar23 = vpshufd_avx2(auVar19,0xf5);
            auVar16 = vpmuldq_avx2(auVar23,auVar23);
            auVar12 = vpaddq_avx2(auVar16,auVar12);
            auVar13 = ZEXT3264(auVar12);
            auVar12 = vpmuldq_avx2(auVar15,auVar19);
            auVar12 = vpaddq_avx2(auVar17._0_32_,auVar12);
            auVar16 = vpsrlq_avx2(auVar15,0x20);
            auVar16 = vpmuldq_avx2(auVar16,auVar23);
            auVar12 = vpaddq_avx2(auVar16,auVar12);
            auVar17 = ZEXT3264(auVar12);
            lVar10 = lVar10 + 8;
          } while (lVar10 < width);
        }
        auVar16 = auVar17._0_32_;
        auVar12 = auVar13._0_32_;
        uVar9 = uVar9 + 1;
        flt1 = flt1 + flt1_stride;
        src8 = src8 + src_stride;
        dat8 = dat8 + dat_stride;
      } while (uVar9 != (uint)height);
    }
    auVar5 = vpaddq_avx(auVar12._16_16_,auVar12._0_16_);
    auVar11 = vpshufd_avx(auVar5,0xee);
    auVar5 = vpaddq_avx(auVar5,auVar11);
    auVar11 = vpaddq_avx(auVar16._16_16_,auVar16._0_16_);
    auVar1 = vpshufd_avx(auVar11,0xee);
    auVar11 = vpaddq_avx(auVar11,auVar1);
    auVar11 = vpslldq_avx(auVar11,8);
    aiVar14 = (int64_t  [2])vpslldq_avx(auVar5,8);
    *(undefined1 (*) [16])C = auVar11;
    H[1] = aiVar14;
    lVar10 = (long)(height * width);
    H[1][1] = auVar5._0_8_ / lVar10;
  }
  else {
    if (params->r[1] < 1) {
      if (height < 1) {
        auVar16 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
        auVar12 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
      }
      else {
        auVar13 = ZEXT1664((undefined1  [16])0x0);
        uVar9 = 0;
        auVar17 = ZEXT1664((undefined1  [16])0x0);
        do {
          if (0 < width) {
            lVar10 = 0;
            do {
              auVar3._8_8_ = 0;
              auVar3._0_8_ = *(ulong *)(dat8 + lVar10);
              auVar12 = vpmovzxbd_avx2(auVar3);
              auVar4._8_8_ = 0;
              auVar4._0_8_ = *(ulong *)(src8 + lVar10);
              auVar16 = vpmovzxbd_avx2(auVar4);
              auVar23 = vpslld_avx2(auVar12,4);
              auVar19 = vpsubd_avx2(*(undefined1 (*) [32])(flt0 + lVar10),auVar23);
              auVar12 = vpsubd_avx2(auVar16,auVar12);
              auVar15 = vpslld_avx2(auVar12,4);
              auVar12 = vpmuldq_avx2(auVar19,auVar19);
              auVar12 = vpaddq_avx2(auVar13._0_32_,auVar12);
              auVar23 = vpshufd_avx2(auVar19,0xf5);
              auVar16 = vpmuldq_avx2(auVar23,auVar23);
              auVar12 = vpaddq_avx2(auVar16,auVar12);
              auVar13 = ZEXT3264(auVar12);
              auVar12 = vpmuldq_avx2(auVar15,auVar19);
              auVar12 = vpaddq_avx2(auVar17._0_32_,auVar12);
              auVar16 = vpsrlq_avx2(auVar15,0x20);
              auVar16 = vpmuldq_avx2(auVar16,auVar23);
              auVar12 = vpaddq_avx2(auVar16,auVar12);
              auVar17 = ZEXT3264(auVar12);
              lVar10 = lVar10 + 8;
            } while (lVar10 < width);
          }
          auVar16 = auVar17._0_32_;
          auVar12 = auVar13._0_32_;
          uVar9 = uVar9 + 1;
          flt0 = flt0 + flt0_stride;
          src8 = src8 + src_stride;
          dat8 = dat8 + dat_stride;
        } while (uVar9 != (uint)height);
      }
      auVar5 = vpaddq_avx(auVar12._16_16_,auVar12._0_16_);
      auVar11 = vpshufd_avx(auVar5,0xee);
      auVar5 = vpaddq_avx(auVar5,auVar11);
      auVar11 = vpaddq_avx(auVar16._16_16_,auVar16._0_16_);
      auVar1 = vpshufd_avx(auVar11,0xee);
      auVar11 = vpaddq_avx(auVar11,auVar1);
      *C = auVar11._0_8_;
      C[1] = 0;
      (*H)[0] = auVar5._0_8_;
      (*H)[1] = 0;
      lVar10 = (long)(height * width);
      (*H)[0] = auVar5._0_8_ / lVar10;
      goto LAB_0048f36b;
    }
    auVar20 = ZEXT1664((undefined1  [16])0x0);
    auVar19 = auVar20._0_32_;
    auVar21 = ZEXT1664((undefined1  [16])0x0);
    auVar15 = auVar21._0_32_;
    auVar17 = ZEXT1664((undefined1  [16])0x0);
    auVar16 = auVar17._0_32_;
    auVar18 = ZEXT1664((undefined1  [16])0x0);
    auVar23 = auVar18._0_32_;
    auVar13 = ZEXT1664((undefined1  [16])0x0);
    auVar12 = auVar13._0_32_;
    if (0 < height) {
      uVar9 = 0;
      do {
        if (0 < width) {
          lVar10 = 0;
          do {
            auVar1._8_8_ = 0;
            auVar1._0_8_ = *(ulong *)(dat8 + lVar10);
            auVar12 = vpmovzxbd_avx2(auVar1);
            auVar2._8_8_ = 0;
            auVar2._0_8_ = *(ulong *)(src8 + lVar10);
            auVar16 = vpmovzxbd_avx2(auVar2);
            auVar23 = vpslld_avx2(auVar12,4);
            auVar12 = vpsubd_avx2(auVar16,auVar12);
            auVar22 = vpslld_avx2(auVar12,4);
            auVar15 = vpsubd_avx2(*(undefined1 (*) [32])(flt0 + lVar10),auVar23);
            auVar6 = vpsubd_avx2(*(undefined1 (*) [32])(flt1 + lVar10),auVar23);
            auVar12 = vpmuldq_avx2(auVar15,auVar15);
            auVar12 = vpaddq_avx2(auVar12,auVar13._0_32_);
            auVar23 = vpshufd_avx2(auVar15,0xf5);
            auVar16 = vpmuldq_avx2(auVar23,auVar23);
            auVar12 = vpaddq_avx2(auVar16,auVar12);
            auVar13 = ZEXT3264(auVar12);
            auVar12 = vpmuldq_avx2(auVar6,auVar15);
            auVar12 = vpaddq_avx2(auVar12,auVar18._0_32_);
            auVar19 = vpshufd_avx2(auVar6,0xf5);
            auVar16 = vpmuldq_avx2(auVar19,auVar23);
            auVar12 = vpaddq_avx2(auVar16,auVar12);
            auVar18 = ZEXT3264(auVar12);
            auVar12 = vpmuldq_avx2(auVar6,auVar6);
            auVar12 = vpaddq_avx2(auVar12,auVar17._0_32_);
            auVar16 = vpmuldq_avx2(auVar19,auVar19);
            auVar12 = vpaddq_avx2(auVar16,auVar12);
            auVar17 = ZEXT3264(auVar12);
            auVar12 = vpmuldq_avx2(auVar22,auVar15);
            auVar12 = vpaddq_avx2(auVar21._0_32_,auVar12);
            auVar15 = vpshufd_avx2(auVar22,0xf5);
            auVar16 = vpmuldq_avx2(auVar15,auVar23);
            auVar12 = vpaddq_avx2(auVar16,auVar12);
            auVar21 = ZEXT3264(auVar12);
            auVar12 = vpmuldq_avx2(auVar6,auVar22);
            auVar12 = vpaddq_avx2(auVar20._0_32_,auVar12);
            auVar16 = vpmuldq_avx2(auVar19,auVar15);
            auVar12 = vpaddq_avx2(auVar16,auVar12);
            auVar20 = ZEXT3264(auVar12);
            lVar10 = lVar10 + 8;
          } while (lVar10 < width);
        }
        auVar16 = auVar17._0_32_;
        auVar23 = auVar18._0_32_;
        auVar15 = auVar21._0_32_;
        auVar12 = auVar13._0_32_;
        auVar19 = auVar20._0_32_;
        uVar9 = uVar9 + 1;
        flt1 = flt1 + flt1_stride;
        flt0 = flt0 + flt0_stride;
        src8 = src8 + src_stride;
        dat8 = dat8 + dat_stride;
      } while (uVar9 != (uint)height);
    }
    auVar6 = vpunpcklqdq_avx2(auVar15,auVar19);
    auVar19 = vpunpckhqdq_avx2(auVar15,auVar19);
    auVar19 = vpaddq_avx2(auVar6,auVar19);
    auVar5 = vpaddq_avx(auVar19._16_16_,auVar19._0_16_);
    auVar19 = vpunpcklqdq_avx2(auVar12,auVar23);
    auVar12 = vpunpckhqdq_avx2(auVar12,auVar23);
    auVar12 = vpaddq_avx2(auVar19,auVar12);
    auVar11 = vpaddq_avx(auVar12._16_16_,auVar12._0_16_);
    auVar23 = vpslldq_avx2(auVar16,8);
    auVar12 = vpblendd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar16,0xcc);
    auVar12 = vpaddq_avx2(auVar23,auVar12);
    auVar1 = vpaddq_avx(auVar12._16_16_,auVar12._0_16_);
    *(undefined1 (*) [16])C = auVar5;
    lVar10 = (long)(height * width);
    (*H)[0] = auVar11._0_8_ / lVar10;
    lVar7 = vpextrq_avx(auVar11,1);
    (*H)[1] = lVar7 / lVar10;
    lVar8 = vpextrq_avx(auVar1,1);
    H[1][1] = lVar8 / lVar10;
    H[1][0] = lVar7 / lVar10;
    *C = *C / lVar10;
  }
  C = C + 1;
LAB_0048f36b:
  *C = *C / lVar10;
  return;
}

Assistant:

void av1_calc_proj_params_avx2(const uint8_t *src8, int width, int height,
                               int src_stride, const uint8_t *dat8,
                               int dat_stride, int32_t *flt0, int flt0_stride,
                               int32_t *flt1, int flt1_stride, int64_t H[2][2],
                               int64_t C[2], const sgr_params_type *params) {
  if ((params->r[0] > 0) && (params->r[1] > 0)) {
    calc_proj_params_r0_r1_avx2(src8, width, height, src_stride, dat8,
                                dat_stride, flt0, flt0_stride, flt1,
                                flt1_stride, H, C);
  } else if (params->r[0] > 0) {
    calc_proj_params_r0_avx2(src8, width, height, src_stride, dat8, dat_stride,
                             flt0, flt0_stride, H, C);
  } else if (params->r[1] > 0) {
    calc_proj_params_r1_avx2(src8, width, height, src_stride, dat8, dat_stride,
                             flt1, flt1_stride, H, C);
  }
}